

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O1

int OpenMD::LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>
              (SquareMatrix<double,_6> *A,int *index,int size,ElemPoinerType tmpSize)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double (*padVar6) [6];
  ulong uVar7;
  double (*padVar8) [6];
  double (*padVar9) [6];
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  double (*padVar13) [6];
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  uVar7 = (ulong)(uint)size;
  if (0 < size) {
    uVar1 = 0;
    padVar8 = (double (*) [6])A;
    do {
      uVar3 = 0;
      dVar17 = 0.0;
      do {
        dVar16 = ABS(((RectMatrix<double,_6U,_6U> *)*padVar8)->data_[0][uVar3]);
        if (dVar16 <= dVar17) {
          dVar16 = dVar17;
        }
        uVar3 = uVar3 + 1;
        dVar17 = dVar16;
      } while (uVar7 != uVar3);
      if ((dVar16 == 0.0) && (!NAN(dVar16))) goto LAB_00271b0f;
      tmpSize[uVar1] = 1.0 / dVar16;
      uVar1 = uVar1 + 1;
      padVar8 = padVar8 + 1;
    } while (uVar1 != uVar7);
  }
  if (0 < size) {
    padVar8 = (A->super_RectMatrix<double,_6U,_6U>).data_ + 1;
    lVar10 = 0;
    uVar3 = 1;
    uVar15 = 0;
    uVar1 = 0;
    pdVar2 = (double *)A;
    padVar6 = (double (*) [6])A;
    do {
      if (uVar15 != 0) {
        uVar12 = 0;
        padVar9 = (double (*) [6])A;
        do {
          dVar17 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar12][uVar15];
          if (uVar12 != 0) {
            uVar4 = 0;
            padVar13 = padVar6;
            do {
              dVar17 = dVar17 - ((RectMatrix<double,_6U,_6U> *)*padVar9)->data_[0][uVar4] *
                                ((RectMatrix<double,_6U,_6U> *)*padVar13)->data_[0][0];
              uVar4 = uVar4 + 1;
              padVar13 = padVar13 + 1;
            } while (uVar12 != uVar4);
          }
          (A->super_RectMatrix<double,_6U,_6U>).data_[uVar12][uVar15] = dVar17;
          uVar12 = uVar12 + 1;
          padVar9 = padVar9 + 1;
        } while (uVar12 != uVar15);
      }
      dVar17 = 0.0;
      pdVar11 = pdVar2;
      uVar12 = uVar15;
      do {
        dVar16 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar12][uVar15];
        if (uVar15 != 0) {
          lVar14 = 0;
          pdVar5 = pdVar11;
          do {
            dVar16 = dVar16 - *pdVar5 * *(double *)((long)*padVar6 + lVar14);
            pdVar5 = pdVar5 + 1;
            lVar14 = lVar14 + 0x30;
          } while (lVar10 != lVar14);
        }
        (A->super_RectMatrix<double,_6U,_6U>).data_[uVar12][uVar15] = dVar16;
        dVar16 = ABS(dVar16) * tmpSize[uVar12];
        if (dVar17 <= dVar16) {
          uVar1 = uVar12 & 0xffffffff;
        }
        dVar17 = (double)(-(ulong)(dVar16 < dVar17) & (ulong)dVar17 |
                         ~-(ulong)(dVar16 < dVar17) & (ulong)dVar16);
        uVar12 = uVar12 + 1;
        pdVar11 = pdVar11 + 6;
      } while (uVar12 != uVar7);
      if (uVar15 != uVar1) {
        uVar12 = 0;
        do {
          dVar17 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar1][uVar12];
          (A->super_RectMatrix<double,_6U,_6U>).data_[uVar1][uVar12] = pdVar2[uVar12];
          pdVar2[uVar12] = dVar17;
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
        tmpSize[(int)uVar1] = tmpSize[uVar15];
      }
      index[uVar15] = (int)uVar1;
      dVar17 = *(double *)((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar15 * 0x38);
      if (ABS(dVar17) <= 1e-12) {
LAB_00271b0f:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to factor linear system",0x1e);
        return 0;
      }
      if ((uVar15 != size - 1) && (uVar15 + 1 < uVar7)) {
        uVar12 = uVar7;
        padVar9 = padVar8;
        do {
          (*padVar9)[0] = (*padVar9)[0] * (1.0 / dVar17);
          padVar9 = padVar9 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar3 != uVar12);
      }
      uVar15 = uVar15 + 1;
      uVar3 = uVar3 + 1;
      padVar6 = (double (*) [6])(*padVar6 + 1);
      pdVar2 = pdVar2 + 6;
      lVar10 = lVar10 + 0x30;
      padVar8 = (double (*) [6])(padVar8[1] + 1);
    } while (uVar15 != uVar7);
  }
  return 1;
}

Assistant:

int LUFactorLinearSystem(MatrixType& A, int* index, int size,
                           typename MatrixType::ElemPoinerType tmpSize) {
    using Real = typename MatrixType::ElemType;

    int i, j, k;
    int maxI = 0;
    Real largest, temp1, temp2, sum;

    //
    // Loop over rows to get implicit scaling information
    //
    for (i = 0; i < size; ++i) {
      for (largest = 0.0, j = 0; j < size; ++j) {
        if ((temp2 = std::abs(A(i, j))) > largest) { largest = temp2; }
      }

      if (largest == 0.0) {
        std::cerr << "Unable to factor linear system";
        return 0;
      }
      tmpSize[i] = 1.0 / largest;
    }
    //
    // Loop over all columns using Crout's method
    //
    for (j = 0; j < size; ++j) {
      for (i = 0; i < j; ++i) {
        sum = A(i, j);
        for (k = 0; k < i; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;
      }
      //
      // Begin search for largest pivot element
      //
      for (largest = 0.0, i = j; i < size; ++i) {
        sum = A(i, j);
        for (k = 0; k < j; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;

        if ((temp1 = tmpSize[i] * std::abs(sum)) >= largest) {
          largest = temp1;
          maxI    = i;
        }
      }
      //
      // Check for row interchange
      //
      if (j != maxI) {
        for (k = 0; k < size; ++k) {
          std::swap(A(maxI, k), A(j, k));
        }
        tmpSize[maxI] = tmpSize[j];
      }
      //
      // Divide by pivot element and perform elimination
      //
      index[j] = maxI;

      if (std::abs(A(j, j)) <= SMALL_NUMBER) {
        std::cerr << "Unable to factor linear system";
        return false;
      }

      if (j != (size - 1)) {
        temp1 = 1.0 / A(j, j);
        for (i = j + 1; i < size; ++i) {
          A(i, j) *= temp1;
        }
      }
    }

    return 1;
  }